

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlvideo.cpp
# Opt level: O3

void __thiscall SDLFB::SDLFB(SDLFB *this,int width,int height,bool fullscreen,SDL_Window *oldwin)

{
  char *pcVar1;
  char *pcVar2;
  SDL_Window *pSVar3;
  long lVar4;
  undefined8 uVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  FString caption;
  FString local_30;
  
  DFrameBuffer::DFrameBuffer(&this->super_DFrameBuffer,width,height);
  (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_008633b0;
  this->NeedPalUpdate = false;
  this->NeedGammaUpdate = false;
  this->UpdatePending = false;
  this->NotPaletted = false;
  this->FlashAmount = 0;
  if (oldwin == (SDL_Window *)0x0) {
    local_30.Chars = FString::NullString.Nothing;
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    pcVar1 = GetVersionString();
    pcVar2 = GetGitTime();
    FString::Format(&local_30,"GZDOOM %s (%s)",pcVar1,pcVar2);
    uVar5 = 0x20;
    if (fullscreen) {
      uVar5 = 0x1021;
    }
    pSVar3 = (SDL_Window *)
             SDL_CreateWindow(local_30.Chars,vid_adapter.Value | 0x1fff0000U,
                              vid_adapter.Value | 0x1fff0000U,width,height,uVar5);
    this->Screen = pSVar3;
    FString::~FString(&local_30);
    if (pSVar3 == (SDL_Window *)0x0) {
      return;
    }
  }
  else {
    this->Screen = oldwin;
    SDL_SetWindowSize(oldwin,width,height);
    SetFullscreen(this,fullscreen);
  }
  this->Renderer = (SDL_Renderer *)0x0;
  this->field_8 = (anon_union_8_2_1d8ad5ef_for_SDLFB_11)0x0;
  ResetSDLRenderer(this);
  cVar6 = '\0';
  cVar7 = '\x01';
  cVar8 = '\x02';
  cVar9 = '\x03';
  cVar10 = '\x04';
  cVar11 = '\x05';
  cVar12 = '\x06';
  cVar13 = '\a';
  cVar14 = '\b';
  cVar15 = '\t';
  cVar16 = '\n';
  cVar17 = '\v';
  cVar18 = '\f';
  cVar19 = '\r';
  cVar20 = '\x0e';
  cVar21 = '\x0f';
  lVar4 = 0x668;
  do {
    pcVar1 = (char *)((long)&(((SDLFB *)(this->SourcePalette + -0x1a))->super_DFrameBuffer).
                             super_DSimpleCanvas.super_DCanvas.super_DObject._vptr_DObject + lVar4);
    *pcVar1 = cVar6;
    pcVar1[1] = cVar7;
    pcVar1[2] = cVar8;
    pcVar1[3] = cVar9;
    pcVar1[4] = cVar10;
    pcVar1[5] = cVar11;
    pcVar1[6] = cVar12;
    pcVar1[7] = cVar13;
    pcVar1[8] = cVar14;
    pcVar1[9] = cVar15;
    pcVar1[10] = cVar16;
    pcVar1[0xb] = cVar17;
    pcVar1[0xc] = cVar18;
    pcVar1[0xd] = cVar19;
    pcVar1[0xe] = cVar20;
    pcVar1[0xf] = cVar21;
    pcVar1 = (char *)((long)this + lVar4 + -0x100);
    *pcVar1 = cVar6;
    pcVar1[1] = cVar7;
    pcVar1[2] = cVar8;
    pcVar1[3] = cVar9;
    pcVar1[4] = cVar10;
    pcVar1[5] = cVar11;
    pcVar1[6] = cVar12;
    pcVar1[7] = cVar13;
    pcVar1[8] = cVar14;
    pcVar1[9] = cVar15;
    pcVar1[10] = cVar16;
    pcVar1[0xb] = cVar17;
    pcVar1[0xc] = cVar18;
    pcVar1[0xd] = cVar19;
    pcVar1[0xe] = cVar20;
    pcVar1[0xf] = cVar21;
    pcVar1 = (char *)((long)this + lVar4 + -0x200);
    *pcVar1 = cVar6;
    pcVar1[1] = cVar7;
    pcVar1[2] = cVar8;
    pcVar1[3] = cVar9;
    pcVar1[4] = cVar10;
    pcVar1[5] = cVar11;
    pcVar1[6] = cVar12;
    pcVar1[7] = cVar13;
    pcVar1[8] = cVar14;
    pcVar1[9] = cVar15;
    pcVar1[10] = cVar16;
    pcVar1[0xb] = cVar17;
    pcVar1[0xc] = cVar18;
    pcVar1[0xd] = cVar19;
    pcVar1[0xe] = cVar20;
    pcVar1[0xf] = cVar21;
    cVar6 = cVar6 + '\x10';
    cVar7 = cVar7 + '\x10';
    cVar8 = cVar8 + '\x10';
    cVar9 = cVar9 + '\x10';
    cVar10 = cVar10 + '\x10';
    cVar11 = cVar11 + '\x10';
    cVar12 = cVar12 + '\x10';
    cVar13 = cVar13 + '\x10';
    cVar14 = cVar14 + '\x10';
    cVar15 = cVar15 + '\x10';
    cVar16 = cVar16 + '\x10';
    cVar17 = cVar17 + '\x10';
    cVar18 = cVar18 + '\x10';
    cVar19 = cVar19 + '\x10';
    cVar20 = cVar20 + '\x10';
    cVar21 = cVar21 + '\x10';
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x768);
  memcpy(this->SourcePalette,&GPalette,0x400);
  UpdateColors(this);
  return;
}

Assistant:

SDLFB::SDLFB (int width, int height, bool fullscreen, SDL_Window *oldwin)
	: DFrameBuffer (width, height)
{
	int i;
	
	NeedPalUpdate = false;
	NeedGammaUpdate = false;
	UpdatePending = false;
	NotPaletted = false;
	FlashAmount = 0;

	if (oldwin)
	{
		// In some cases (Mac OS X fullscreen) SDL2 doesn't like having multiple windows which
		// appears to inevitably happen while compositor animations are running. So lets try
		// to reuse the existing window.
		Screen = oldwin;
		SDL_SetWindowSize (Screen, width, height);
		SetFullscreen (fullscreen);
	}
	else
	{
		FString caption;
		caption.Format(GAMESIG " %s (%s)", GetVersionString(), GetGitTime());

		Screen = SDL_CreateWindow (caption,
			SDL_WINDOWPOS_UNDEFINED_DISPLAY(vid_adapter), SDL_WINDOWPOS_UNDEFINED_DISPLAY(vid_adapter),
			width, height, (fullscreen ? SDL_WINDOW_FULLSCREEN_DESKTOP : 0)|SDL_WINDOW_RESIZABLE);

		if (Screen == NULL)
			return;
	}

	Renderer = NULL;
	Texture = NULL;
	ResetSDLRenderer ();

	for (i = 0; i < 256; i++)
	{
		GammaTable[0][i] = GammaTable[1][i] = GammaTable[2][i] = i;
	}

	memcpy (SourcePalette, GPalette.BaseColors, sizeof(PalEntry)*256);
	UpdateColors ();

#ifdef __APPLE__
	SetVSync (vid_vsync > 0);
#endif
}